

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O1

vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
obj::load_from_stream<float>
          (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
           *__return_storage_ptr__,istream *is)

{
  undefined8 *puVar1;
  char *pcVar2;
  char cVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  _Storage<int,_true> _Var7;
  long *plVar8;
  ulong uVar9;
  _Optional_base<int,_true,_true> _Var10;
  ulong uVar11;
  long lVar12;
  Vec<float,_3UL> *pVVar13;
  uint uVar14;
  char *pcVar15;
  char *__nptr;
  float fVar16;
  char *ptr;
  float y;
  float z;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> vertices;
  float x;
  char line [1024];
  char *local_4a0;
  Vec<float,_3UL> local_498;
  vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *local_488;
  float local_47c;
  void *local_478;
  long lStack_470;
  long local_468;
  Vec<float,_3UL> local_458;
  Vec<float,_3UL> local_44c;
  char local_438 [1032];
  
  local_468 = 0;
  local_478 = (void *)0x0;
  lStack_470 = 0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488 = (vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)
              __return_storage_ptr__;
  do {
    do {
      std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
      plVar8 = (long *)std::istream::getline((char *)is,(long)local_438,'\0');
      __nptr = local_438;
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
        if (local_478 != (void *)0x0) {
          operator_delete(local_478,local_468 - (long)local_478);
        }
        return (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
               local_488;
      }
      do {
        pcVar15 = __nptr;
        cVar3 = *pcVar15;
        iVar6 = isspace((int)cVar3);
        __nptr = pcVar15 + 1;
      } while (iVar6 != 0);
      local_4a0 = pcVar15;
    } while ((cVar3 == '\0') || (cVar3 == '#'));
    uVar9 = 0xffffffffffffffff;
    lVar5 = 1;
    do {
      lVar12 = lVar5;
      pcVar2 = __nptr + uVar9;
      uVar9 = uVar9 + 1;
      lVar5 = lVar12 + 1;
    } while (*pcVar2 != '\0');
    if (1 < uVar9) {
      do {
        uVar14 = (int)lVar12 - 2;
        iVar6 = isspace((int)pcVar15[uVar14]);
        if (iVar6 == 0) break;
        pcVar15[uVar14] = '\0';
        lVar12 = lVar12 + -1;
      } while (2 < lVar12);
    }
    if (*pcVar15 == 'f') {
      iVar6 = isspace((int)*__nptr);
      if (iVar6 != 0) {
        local_4a0 = pcVar15 + 2;
        _Var10._M_payload.super__Optional_payload_base<int> =
             (_Optional_payload<int,_true,_true,_true>)read_index(&local_4a0);
        if (((ulong)_Var10._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0) {
          pVVar13 = &local_458;
          uVar9 = 0;
          do {
            _Var7._M_value = _Var10._M_payload.super__Optional_payload_base<int>._M_payload;
            if (_Var7._M_value < 0) {
              uVar11 = (long)_Var7._M_value +
                       (lStack_470 - (long)local_478 >> 2) * -0x5555555555555555;
            }
            else {
              uVar11 = (ulong)(_Var7._M_value + -1);
            }
            if ((ulong)((lStack_470 - (long)local_478 >> 2) * -0x5555555555555555) <= uVar11) {
              __assert_fail("j < vertices.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/test/load_obj.cpp"
                            ,0x50,
                            "std::vector<Tri<T, 3>> obj::load_from_stream(std::istream &) [T = float]"
                           );
            }
            local_498.values[2] = *(float *)((long)local_478 + uVar11 * 0xc + 8);
            local_498.values._0_8_ = *(undefined8 *)((long)local_478 + uVar11 * 0xc);
            if (uVar9 < 2) {
              puVar1 = (undefined8 *)((long)local_478 + uVar11 * 0xc);
              uVar4 = *puVar1;
              pVVar13->values[2] = *(float *)(puVar1 + 1);
              *(undefined8 *)pVVar13->values = uVar4;
            }
            else {
              std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
              emplace_back<bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&>
                        (local_488,&local_458,&local_44c,&local_498);
              local_44c.values[2] = local_498.values[2];
              local_44c.values[0] = local_498.values[0];
              local_44c.values[1] = local_498.values[1];
            }
            uVar9 = uVar9 + 1;
            _Var10._M_payload.super__Optional_payload_base<int> =
                 (_Optional_payload<int,_true,_true,_true>)read_index(&local_4a0);
            pVVar13 = pVVar13 + 1;
          } while (((ulong)_Var10._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0);
        }
      }
    }
    else if ((*pcVar15 == 'v') && (iVar6 = isspace((int)*__nptr), iVar6 != 0)) {
      local_458.values[0] = strtof(__nptr,&local_4a0);
      fVar16 = strtof(local_4a0,&local_4a0);
      local_498.values[0] = fVar16;
      local_47c = strtof(local_4a0,&local_4a0);
      std::vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>>::
      emplace_back<float&,float&,float&>
                ((vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>> *)
                 &local_478,local_458.values,local_498.values,&local_47c);
    }
  } while( true );
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_stream(std::istream& is) {
    static constexpr size_t max_line = 1024;
    char line[max_line];

    std::vector<Vec<T, 3>> vertices;
    std::vector<Tri<T, 3>> triangles;

    while (is.getline(line, max_line)) {
        char* ptr = strip_spaces(line);
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_eol(ptr);
        if (*ptr == 'v' && std::isspace(ptr[1])) {
            auto x = std::strtof(ptr + 1, &ptr);
            auto y = std::strtof(ptr, &ptr);
            auto z = std::strtof(ptr, &ptr);
            vertices.emplace_back(x, y, z);
        } else if (*ptr == 'f' && std::isspace(ptr[1])) {
            Vec<T, 3> points[2];
            ptr += 2;
            for (size_t i = 0; ; ++i) {
                if (auto index = read_index(&ptr)) {
                    size_t j = *index < 0 ? vertices.size() + *index : *index - 1;
                    assert(j < vertices.size());
                    auto v = vertices[j];
                    if (i >= 2) {
                        triangles.emplace_back(points[0], points[1], v);
                        points[1] = v;
                    } else {
                        points[i] = v;
                    }
                } else {
                    break;
                }
            }
        }
    }

    return triangles;
}